

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VoxWriter.cpp
# Opt level: O0

ssize_t __thiscall vox::XYZI::write(XYZI *this,int __fd,void *__buf,size_t __n)

{
  uchar *__ptr;
  size_type __n_00;
  size_t sVar1;
  undefined4 in_register_00000034;
  undefined8 local_30;
  size_t childSize;
  size_t contentSize;
  FILE *pFStack_18;
  int32_t id;
  FILE *fp_local;
  XYZI *this_local;
  
  pFStack_18 = (FILE *)CONCAT44(in_register_00000034,__fd);
  fp_local = (FILE *)this;
  contentSize._4_4_ = GetMVID('X','Y','Z','I');
  fwrite((void *)((long)&contentSize + 4),4,1,pFStack_18);
  childSize = getSize(this);
  fwrite(&childSize,4,1,pFStack_18);
  local_30 = 0;
  fwrite(&local_30,4,1,pFStack_18);
  fwrite(this,4,1,pFStack_18);
  __ptr = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&this->voxels);
  __n_00 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->voxels);
  sVar1 = fwrite(__ptr,1,__n_00,pFStack_18);
  return sVar1;
}

Assistant:

void XYZI::write(FILE* fp) {
    // chunk header
    int32_t id = GetMVID('X', 'Y', 'Z', 'I');
    fwrite(&id, sizeof(int32_t), 1, fp);
    size_t contentSize = getSize();
    fwrite(&contentSize, sizeof(int32_t), 1, fp);
    size_t childSize = 0;
    fwrite(&childSize, sizeof(int32_t), 1, fp);

    // datas's
    fwrite(&numVoxels, sizeof(int32_t), 1, fp);
    fwrite(voxels.data(), sizeof(uint8_t), voxels.size(), fp);
}